

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_receive_fragmented_frames(void)

{
  frame_direction fVar1;
  uint length;
  uint length_00;
  cio_error cVar2;
  void *__s;
  uint local_f8;
  uint local_f4;
  uint read_cnt;
  uint arg_history_counter;
  cio_error err;
  ws_frame frames [3];
  char *last_data;
  char *first_data;
  frame_direction dir;
  uint32_t second_frame_size;
  uint32_t first_frame_size;
  uint frame_type;
  uint l;
  uint k;
  uint j;
  uint i;
  frame_direction dirs [2];
  uint frame_types [2];
  uint32_t second_frame_sizes [7];
  uint32_t first_frame_sizes [7];
  
  stack0xffffffffffffffd8 = 0x100000000;
  frame_types[0] = 0;
  frame_types[1] = 1;
  second_frame_sizes[0] = 5;
  second_frame_sizes[1] = 0x7d;
  second_frame_sizes[2] = 0x7e;
  second_frame_sizes[3] = 0xffff;
  second_frame_sizes[4] = 0x10000;
  dirs[0] = 2;
  dirs[1] = FROM_SERVER;
  _j = 0x100000000;
  k = 0;
  do {
    if (6 < k) {
      return;
    }
    for (l = 0; l < 7; l = l + 1) {
      for (frame_type = 0; frame_type < 2; frame_type = frame_type + 1) {
        for (first_frame_size = 0; first_frame_size < 2; first_frame_size = first_frame_size + 1) {
          fVar1 = dirs[frame_type];
          length = second_frame_sizes[(ulong)k + 6];
          length_00 = frame_types[l];
          cVar2 = (&j)[first_frame_size];
          __s = malloc((ulong)length);
          memset(__s,0x61,(ulong)length);
          frames[2]._24_8_ = malloc((ulong)length_00);
          memset((void *)frames[2]._24_8_,0x62,(ulong)length_00);
          frames[0].data = (void *)(ulong)length;
          frames[0].data_length._0_1_ = 0;
          frames[0].data_length._1_1_ = 0;
          frames[0].last_frame = false;
          frames[0].rsv = false;
          frames[0]._26_2_ = 0;
          frames[1]._0_8_ = frames[2]._24_8_;
          frames[1].data = (void *)(ulong)length_00;
          frames[1].data_length._0_1_ = 1;
          frames[1].data_length._1_1_ = 0;
          frames[1].last_frame = true;
          frames[1].rsv = false;
          frames[1]._26_2_ = 0;
          frames[2].frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME;
          frames[2].direction = FROM_CLIENT;
          frames[2].data = (void *)0x0;
          frames[2].data_length._0_1_ = 1;
          frames[2].data_length._1_1_ = 0;
          arg_history_counter = fVar1;
          err = cVar2;
          frames[0]._0_8_ = __s;
          frames[0]._28_4_ = cVar2;
          frames[1]._28_4_ = cVar2;
          serialize_frames((ws_frame *)&arg_history_counter,3);
          *(ushort *)&(ws->ws_private).ws_flags =
               *(ushort *)&(ws->ws_private).ws_flags & 0xfbff | (ushort)(cVar2 == CIO_SUCCESS) << 10
          ;
          cVar2 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
          UnityAssertEqualNumber
                    (0,(long)cVar2,"Could not start reading a message!",0x30f,
                     UNITY_DISPLAY_STYLE_INT);
          UnityAssertGreaterOrLessOrEqualNumber
                    (3,(ulong)read_handler_fake.call_count,UNITY_GREATER_OR_EQUAL,
                     "read_handler was not called",0x311,UNITY_DISPLAY_STYLE_INT);
          if (read_handler_fake.arg_history_len < read_handler_fake.call_count) {
            local_f8 = read_handler_fake.arg_history_len;
          }
          else {
            local_f8 = read_handler_fake.call_count;
          }
          for (local_f4 = 0; local_f4 < local_f8; local_f4 = local_f4 + 1) {
            UnityAssertEqualNumber
                      ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[local_f4],
                       "websocket parameter of read_handler not correct",0x314,
                       UNITY_DISPLAY_STYLE_INT);
            if (read_handler_fake.arg1_history[local_f4] != (void *)0x0) {
              UnityFail("context parameter of read handler not NULL",0x315);
            }
            if (local_f4 < read_handler_fake.call_count - 1) {
              UnityAssertEqualNumber
                        (0,(long)read_handler_fake.arg2_history[local_f4],
                         "error parameter of read_handler not CIO_SUCCESS",0x317,
                         UNITY_DISPLAY_STYLE_INT);
              if ((local_f4 == 0) && ((read_handler_fake.arg7_history[0] & 1U) != 0)) {
                UnityFail("last_frame parameter of read_handler for first fragment not false",0x319)
                ;
              }
              UnityAssertEqualNumber
                        ((long)(int)(uint)(fVar1 == 2),
                         (ulong)(read_handler_fake.arg8_history[local_f4] & 1),
                         "is_binary parameter of read_handler for first fragment not correct",0x31b,
                         UNITY_DISPLAY_STYLE_INT);
            }
            else {
              UnityAssertEqualNumber
                        (1,(long)read_handler_fake.arg2_history[local_f4],
                         "err parameter of read_handler not correct",0x31d,UNITY_DISPLAY_STYLE_INT);
            }
          }
          UnityAssertEqualNumber
                    (0,(ulong)on_error_fake.call_count,"error callback was called",0x321,
                     UNITY_DISPLAY_STYLE_INT);
          if ((length != 0) &&
             (UnityAssertEqualMemory
                        (__s,read_back_buffer,length,1,
                         "data in data/binaray frame callback not correct",0x323,
                         UNITY_ARRAY_TO_ARRAY), length_00 != 0)) {
            UnityAssertEqualMemory
                      ((void *)frames[2]._24_8_,read_back_buffer + length,length_00,1,
                       "data in data/binaray frame callback not correct",0x325,UNITY_ARRAY_TO_ARRAY)
            ;
          }
          UnityAssertEqualNumber
                    (1,(ulong)on_control_fake.call_count,
                     "control callback was not called for last close frame",0x329,
                     UNITY_DISPLAY_STYLE_INT);
          if (on_control_fake.arg0_val == (cio_websocket *)0x0) {
            UnityFail("websocket parameter of control callback is NULL",0x32a);
          }
          UnityAssertEqualNumber
                    (8,(ulong)on_control_fake.arg1_val,
                     "websocket parameter of control callback is NULL",0x32b,UNITY_DISPLAY_STYLE_INT
                    );
          if (on_control_fake.arg2_val != (uint8_t *)0x0) {
            UnityFail("data parameter of control callback is not correct",0x32c);
          }
          UnityAssertEqualNumber
                    (0,(ulong)on_control_fake.arg3_val,
                     "data length parameter of control callback is not correct",0x32d,
                     UNITY_DISPLAY_STYLE_INT);
          free(ws);
          free(__s);
          free((void *)frames[2]._24_8_);
          setUp();
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static void test_receive_fragmented_frames(void)
{
	uint32_t first_frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	uint32_t second_frame_sizes[] = {0, 1, 5, 125, 126, 65535, 65536};
	unsigned int frame_types[] = {CIO_WEBSOCKET_BINARY_FRAME, CIO_WEBSOCKET_TEXT_FRAME};
	enum frame_direction dirs[] = {FROM_CLIENT, FROM_SERVER};

	for (unsigned int i = 0; i < ARRAY_SIZE(first_frame_sizes); i++) {
		for (unsigned int j = 0; j < ARRAY_SIZE(second_frame_sizes); j++) {
			for (unsigned int k = 0; k < ARRAY_SIZE(frame_types); k++) {
				for (unsigned int l = 0; l < ARRAY_SIZE(dirs); l++) {
					unsigned int frame_type = frame_types[k];
					uint32_t first_frame_size = first_frame_sizes[i];
					uint32_t second_frame_size = second_frame_sizes[j];
					enum frame_direction dir = dirs[l];

					char *first_data = malloc(first_frame_size);
					memset(first_data, 'a', first_frame_size);

					char *last_data = malloc(second_frame_size);
					memset(last_data, 'b', second_frame_size);
					struct ws_frame frames[] = {
					    {.frame_type = frame_type, .direction = dir, .data = first_data, .data_length = first_frame_size, .last_frame = false},
					    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = dir, .data = last_data, .data_length = second_frame_size, .last_frame = true, .rsv = false},
					    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = dir, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
					};

					serialize_frames(frames, ARRAY_SIZE(frames));

					ws->ws_private.ws_flags.is_server = (dir == FROM_CLIENT) ? 1 : 0;
					enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
					TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

					TEST_ASSERT_GREATER_OR_EQUAL_MESSAGE(3, read_handler_fake.call_count, "read_handler was not called");
					unsigned int arg_history_counter = CIO_MIN(read_handler_fake.arg_history_len, read_handler_fake.call_count);
					for (unsigned int read_cnt = 0; read_cnt < arg_history_counter; read_cnt++) {
						TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_history[read_cnt], "websocket parameter of read_handler not correct");
						TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[read_cnt], "context parameter of read handler not NULL");
						if (read_cnt < read_handler_fake.call_count - 1) {
							TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[read_cnt], "error parameter of read_handler not CIO_SUCCESS");
							if (read_cnt == 0) {
								TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg7_history[read_cnt], "last_frame parameter of read_handler for first fragment not false");
							}
							TEST_ASSERT_EQUAL_MESSAGE((frame_type == CIO_WEBSOCKET_BINARY_FRAME), read_handler_fake.arg8_history[read_cnt], "is_binary parameter of read_handler for first fragment not correct");
						} else {
							TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[read_cnt], "err parameter of read_handler not correct");
						}
					}

					TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");
					if (first_frame_size > 0) {
						TEST_ASSERT_EQUAL_MEMORY_MESSAGE(first_data, read_back_buffer, first_frame_size, "data in data/binaray frame callback not correct");
						if (second_frame_size > 0) {
							TEST_ASSERT_EQUAL_MEMORY_MESSAGE(last_data, &read_back_buffer[first_frame_size], second_frame_size, "data in data/binaray frame callback not correct");
						}
					}

					TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was not called for last close frame");
					TEST_ASSERT_NOT_NULL_MESSAGE(on_control_fake.arg0_val, "websocket parameter of control callback is NULL");
					TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "websocket parameter of control callback is NULL");
					TEST_ASSERT_NULL_MESSAGE(on_control_fake.arg2_val, "data parameter of control callback is not correct");
					TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.arg3_val, "data length parameter of control callback is not correct");

					free(ws);
					free(first_data);
					free(last_data);
					setUp();
				}
			}
		}
	}
}